

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grant_message.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::price::pixie::GrantMessage::ToString_abi_cxx11_
          (string *__return_storage_ptr__,GrantMessage *this)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"Grant(granted=");
  pcVar2 = "false";
  if (this->granted_ != false) {
    pcVar2 = "true";
  }
  std::operator<<(local_190,pcVar2);
  poVar1 = std::operator<<(local_190,", reason=");
  poVar1 = std::operator<<(poVar1,(string *)&this->reason_);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

const std::string GrantMessage::ToString()
{
    std::stringstream ss;

    ss << "Grant(granted=";

    if (granted_)
    {
        ss << "true";
    }
    else
    {
        ss << "false";
    }
    ss << ", reason=" << reason_ << ")";
    return ss.str();
}